

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

bool __thiscall
matchit::impl::Id<mathiu::impl::Pair>::matchValue<mathiu::impl::Pair_const&>
          (Id<mathiu::impl::Pair> *this,Pair *v)

{
  bool bVar1;
  ExprPtrPair *l;
  BlockT *pBVar2;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    l = &internalValue(this)->super_ExprPtrPair;
    bVar1 = mathiu::impl::operator==(l,&v->super_ExprPtrPair);
    return bVar1;
  }
  pBVar2 = block(this);
  IdUtil<mathiu::impl::Pair>::bindValue<mathiu::impl::Pair_const&>
            (&(pBVar2->super_IdBlockBase<mathiu::impl::Pair>).mVariant,v);
  return true;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }